

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# translate.c
# Opt level: O0

void gen_mfhc0_entrylo(TCGContext_conflict6 *tcg_ctx,TCGv_i64 arg,target_ulong off)

{
  TCGv_i64 ret;
  TCGv_i64 t0;
  target_ulong off_local;
  TCGv_i64 arg_local;
  TCGContext_conflict6 *tcg_ctx_local;
  
  ret = tcg_temp_new_i64(tcg_ctx);
  tcg_gen_ld_i64_mips64el(tcg_ctx,ret,tcg_ctx->cpu_env,off);
  tcg_gen_shri_i64_mips64el(tcg_ctx,ret,ret,0x1e);
  gen_move_low32(tcg_ctx,arg,ret);
  tcg_temp_free_i64(tcg_ctx,ret);
  return;
}

Assistant:

static inline void gen_mfhc0_entrylo(TCGContext *tcg_ctx, TCGv arg, target_ulong off)
{
    TCGv_i64 t0 = tcg_temp_new_i64(tcg_ctx);

    tcg_gen_ld_i64(tcg_ctx, t0, tcg_ctx->cpu_env, off);
#if defined(TARGET_MIPS64)
    tcg_gen_shri_i64(tcg_ctx, t0, t0, 30);
#else
    tcg_gen_shri_i64(tcg_ctx, t0, t0, 32);
#endif
    gen_move_low32(tcg_ctx, arg, t0);
    tcg_temp_free_i64(tcg_ctx, t0);
}